

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLsMassInitialize(void *arkode_mem)

{
  SUNMatrix p_Var1;
  int iVar2;
  SUNLinearSolver_Type SVar3;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  ARKodeMem local_28;
  ARKLsMassMem local_20;
  
  iVar2 = arkLs_AccessMassMem(arkode_mem,"arkLsMassInitialize",&local_28,&local_20);
  if (iVar2 != 0) {
    return iVar2;
  }
  local_20->nli = 0;
  local_20->nps = 0;
  local_20->nmvsetup = 0;
  local_20->npe = 0;
  local_20->nmtsetup = 0;
  local_20->nmtimes = 0;
  local_20->nmsetups = 0;
  local_20->nmsolves = 0;
  local_20->ncfl = 0;
  local_20->msetuptime = -1.79769313486232e+308;
  p_Var1 = local_20->M;
  if (p_Var1 == (SUNMatrix)0x0) {
LAB_0040e668:
    if ((local_20->mtimes == (ARKLsMassTimesVecFn)0x0) &&
       (SVar3 = SUNLinSolGetType(local_20->LS), SVar3 != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      msgfmt = "Missing user-provided mass matrix-vector product routine";
    }
    else {
LAB_0040e687:
      if (local_20->LS != (SUNLinearSolver)0x0) {
        if ((((local_20->M == (SUNMatrix)0x0) && (local_20->pset == (ARKLsMassPrecSetupFn)0x0)) &&
            (local_20->mtsetup == (ARKLsMassTimesSetupFn)0x0)) &&
           (local_28->step_disablemsetup != (ARKTimestepDisableMSetup)0x0)) {
          (*local_28->step_disablemsetup)(arkode_mem);
        }
        SVar3 = SUNLinSolGetType(local_20->LS);
        if (SVar3 == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
          (*local_28->step_disablemsetup)(arkode_mem);
        }
        iVar2 = SUNLinSolInitialize(local_20->LS);
        goto LAB_0040e76a;
      }
      msgfmt = "Missing SUNLinearSolver object";
    }
  }
  else if (local_20->mass == (ARKLsMassFn)0x0) {
    msgfmt = "Missing user-provided mass-matrix routine";
  }
  else {
    if ((local_20->mtimes != (ARKLsMassTimesVecFn)0x0) ||
       (p_Var1->ops->matvec != (_func_int_SUNMatrix_N_Vector_N_Vector *)0x0)) {
      if (p_Var1 == (SUNMatrix)0x0) goto LAB_0040e668;
      goto LAB_0040e687;
    }
    msgfmt = "No available mass matrix-vector product routine";
  }
  iVar2 = -3;
  arkProcessError(local_28,-3,"ARKLS","arkLsMassInitialize",msgfmt);
LAB_0040e76a:
  local_20->last_flag = iVar2;
  return iVar2;
}

Assistant:

int arkLsMassInitialize(void *arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMassInitialize",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* reset counters */
  arkLsInitializeMassCounters(arkls_mem);

  /* perform checks for matrix-based mass system */
  if (arkls_mem->M != NULL) {
    /* check for user-provided mass matrix constructor */
    if (arkls_mem->mass == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLsMassInitialize",
                      "Missing user-provided mass-matrix routine");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(arkls_mem->last_flag);
    }
    /* check that someone can perform matrix-vector product */
    if ((arkls_mem->mtimes == NULL) && (arkls_mem->M->ops->matvec == NULL)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLsMassInitialize",
                      "No available mass matrix-vector product routine");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(arkls_mem->last_flag);
    }
  }

  /* perform checks for matrix-free mass system */
  if ((arkls_mem->M == NULL) && (arkls_mem->mtimes == NULL) &&
      (SUNLinSolGetType(arkls_mem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsMassInitialize",
                    "Missing user-provided mass matrix-vector product routine");
    arkls_mem->last_flag = ARKLS_ILL_INPUT;
    return(arkls_mem->last_flag);
  }

  /* ensure that a mass matrix solver exists */
  if (arkls_mem->LS == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLsMassInitialize",
                    "Missing SUNLinearSolver object");
    arkls_mem->last_flag = ARKLS_ILL_INPUT;
    return(arkls_mem->last_flag);
  }

  /* if M is NULL and neither pset or mtsetup are present, then
     arkLsMassSetup does not need to be called, so set the
     msetup function to NULL */
  if ( (arkls_mem->M == NULL) &&
       (arkls_mem->pset == NULL) &&
       (arkls_mem->mtsetup == NULL) &&
       (ark_mem->step_disablemsetup != NULL) )
    ark_mem->step_disablemsetup(arkode_mem);

  /* When using a matrix-embedded linear solver, disable lsetup call */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
    ark_mem->step_disablemsetup(arkode_mem);

  /* Call LS initialize routine */
  arkls_mem->last_flag = SUNLinSolInitialize(arkls_mem->LS);
  return(arkls_mem->last_flag);
}